

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_13uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  byte bVar13;
  uint uVar14;
  int needed;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  
  if ((length & 0xfffffffffffffff8) == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    do {
      bVar1 = pSrc[1];
      bVar13 = pSrc[2];
      bVar2 = pSrc[3];
      bVar3 = pSrc[4];
      bVar4 = pSrc[5];
      bVar5 = pSrc[6];
      bVar6 = pSrc[7];
      bVar7 = pSrc[8];
      bVar8 = pSrc[9];
      bVar9 = pSrc[10];
      bVar10 = pSrc[0xb];
      bVar11 = pSrc[0xc];
      pDst[uVar16] = (uint)(bVar1 >> 3) | (uint)*pSrc << 5;
      pDst[uVar16 + 1] = (uint)(bVar2 >> 6) | (bVar1 & 7) * 0x400 + (uint)bVar13 * 4;
      pDst[uVar16 + 2] = (uint)(bVar3 >> 1) | (bVar2 & 0x3f) << 7;
      pDst[uVar16 + 3] = (uint)(bVar5 >> 4) | (uint)bVar4 << 4 | (bVar3 & 1) << 0xc;
      pDst[uVar16 + 4] = (uint)(bVar7 >> 7) | (bVar5 & 0xf) * 0x200 + (uint)bVar6 * 2;
      pDst[uVar16 + 5] = (uint)(bVar8 >> 2) | (bVar7 & 0x7f) << 6;
      pDst[uVar16 + 6] = (uint)(bVar10 >> 5) | (bVar8 & 3) * 0x800 + (uint)bVar9 * 8;
      pDst[uVar16 + 7] = (bVar10 & 0x1f) << 8 | (uint)bVar11;
      pSrc = pSrc + 0xd;
      uVar16 = uVar16 + 8;
    } while (uVar16 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    uVar17 = (uint)pSrc[1];
    pDst[uVar16] = (uint)(pSrc[1] >> 3) | (uint)*pSrc << 5;
    uVar14 = (uint)(length & 7);
    if (uVar14 != 1) {
      iVar12 = 3;
      uVar15 = 0xd;
      uVar18 = 0;
      pbVar19 = pSrc + 2;
      do {
        pbVar20 = pbVar19;
        uVar15 = uVar15 - iVar12;
        bVar1 = (byte)uVar15 & 0x1f;
        uVar18 = (uVar18 | ~(-1 << (sbyte)iVar12) & uVar17) << bVar1;
        uVar17 = (uint)*pbVar20;
        pbVar19 = pbVar20 + 1;
        iVar12 = 8;
      } while (8 < uVar15);
      iVar12 = 8 - uVar15;
      pDst[uVar16 + 1] =
           ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar20 >> ((byte)iVar12 & 0x1f)) | uVar18;
      if (2 < uVar14) {
        if (uVar15 == 8) {
          uVar17 = (uint)*pbVar19;
          pbVar19 = pbVar20 + 2;
          iVar12 = 8;
        }
        uVar15 = 0xd;
        uVar18 = 0 << bVar1;
        do {
          pbVar20 = pbVar19;
          uVar15 = uVar15 - iVar12;
          bVar1 = (byte)uVar15 & 0x1f;
          uVar18 = (uVar18 | ~(-1 << ((byte)iVar12 & 0x1f)) & uVar17) << bVar1;
          uVar17 = (uint)*pbVar20;
          pbVar19 = pbVar20 + 1;
          iVar12 = 8;
        } while (8 < uVar15);
        iVar12 = 8 - uVar15;
        pDst[uVar16 + 2] =
             ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar20 >> ((byte)iVar12 & 0x1f)) | uVar18;
        if (uVar14 != 3) {
          if (uVar15 == 8) {
            uVar17 = (uint)*pbVar19;
            pbVar19 = pbVar20 + 2;
            iVar12 = 8;
          }
          uVar15 = 0xd;
          uVar18 = 0 << bVar1;
          do {
            pbVar20 = pbVar19;
            uVar15 = uVar15 - iVar12;
            bVar1 = (byte)uVar15 & 0x1f;
            uVar18 = (uVar18 | ~(-1 << ((byte)iVar12 & 0x1f)) & uVar17) << bVar1;
            uVar17 = (uint)*pbVar20;
            pbVar19 = pbVar20 + 1;
            iVar12 = 8;
          } while (8 < uVar15);
          iVar12 = 8 - uVar15;
          pDst[uVar16 + 3] =
               ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar20 >> ((byte)iVar12 & 0x1f)) | uVar18;
          if (4 < uVar14) {
            if (uVar15 == 8) {
              uVar17 = (uint)*pbVar19;
              pbVar19 = pbVar20 + 2;
              iVar12 = 8;
            }
            uVar15 = 0xd;
            uVar18 = 0 << bVar1;
            do {
              pbVar20 = pbVar19;
              uVar15 = uVar15 - iVar12;
              bVar1 = (byte)uVar15 & 0x1f;
              uVar18 = (uVar18 | ~(-1 << ((byte)iVar12 & 0x1f)) & uVar17) << bVar1;
              uVar17 = (uint)*pbVar20;
              pbVar19 = pbVar20 + 1;
              iVar12 = 8;
            } while (8 < uVar15);
            iVar12 = 8 - uVar15;
            pDst[uVar16 + 4] =
                 ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar20 >> ((byte)iVar12 & 0x1f)) | uVar18
            ;
            if (uVar14 != 5) {
              if (uVar15 == 8) {
                uVar17 = (uint)*pbVar19;
                pbVar19 = pbVar20 + 2;
                iVar12 = 8;
              }
              uVar15 = 0xd;
              uVar18 = 0 << bVar1;
              do {
                pbVar20 = pbVar19;
                uVar15 = uVar15 - iVar12;
                uVar18 = (uVar18 | ~(-1 << ((byte)iVar12 & 0x1f)) & uVar17) << ((byte)uVar15 & 0x1f)
                ;
                uVar17 = (uint)*pbVar20;
                pbVar19 = pbVar20 + 1;
                iVar12 = 8;
              } while (8 < uVar15);
              iVar12 = 8 - uVar15;
              pDst[uVar16 + 5] =
                   ~(-1 << ((byte)uVar15 & 0x1f)) & (uint)(*pbVar20 >> ((byte)iVar12 & 0x1f)) |
                   uVar18;
              if (uVar14 == 7) {
                if (uVar15 == 8) {
                  uVar17 = (uint)*pbVar19;
                  pbVar19 = pbVar20 + 2;
                  iVar12 = 8;
                }
                uVar14 = 0xd;
                uVar15 = 0;
                do {
                  uVar14 = uVar14 - iVar12;
                  bVar13 = (byte)uVar14;
                  uVar15 = (uVar15 | ~(-1 << ((byte)iVar12 & 0x1f)) & uVar17) << (bVar13 & 0x1f);
                  bVar1 = *pbVar19;
                  uVar17 = (uint)bVar1;
                  pbVar19 = pbVar19 + 1;
                  iVar12 = 8;
                } while (8 < uVar14);
                pDst[uVar16 + 6] =
                     ~(-1 << (bVar13 & 0x1f)) & (uint)(bVar1 >> (8 - bVar13 & 0x1f)) | uVar15;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_13uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;
        OPJ_UINT32 val9 = *pSrc++;
        OPJ_UINT32 val10 = *pSrc++;
        OPJ_UINT32 val11 = *pSrc++;
        OPJ_UINT32 val12 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 5) | (val1 >> 3));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x7U) << 10) | (val2 << 2) | (val3 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val3 & 0x3FU) << 7) | (val4 >> 1));
        pDst[i + 3] = (OPJ_INT32)(((val4 & 0x1U) << 12) | (val5 << 4) | (val6 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val6 & 0xFU) << 9) | (val7 << 1) | (val8 >> 7));
        pDst[i + 5] = (OPJ_INT32)(((val8 & 0x7FU) << 6) | (val9 >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val9 & 0x3U) << 11) | (val10 << 3) | (val11 >> 5));
        pDst[i + 7] = (OPJ_INT32)(((val11 & 0x1FU) << 8) | (val12));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 13)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 13)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 13)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 13)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 13)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 13)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 13)
                            }
                        }
                    }
                }
            }
        }
    }
}